

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void NetworkDataType::
     deserializedata<unsigned_char,unsigned_char,unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
               (binarydata *data,uchar *args,uchar *args_1,unsigned_short *args_2,
               unsigned_short *args_3,unsigned_short *args_4,unsigned_short *args_5,
               unsigned_short *args_6,uchar *args_7,unsigned_short *args_8,uchar *args_9,
               unsigned_short *args_10,unsigned_short *args_11,unsigned_short *args_12,
               unsigned_short *args_13)

{
  Options local_2b9;
  PortableBinaryInputArchive archive;
  stringstream stream;
  
  std::__cxx11::string::string((string *)&archive,(string *)data);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&archive,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&archive);
  local_2b9.itsInputEndianness = cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (&archive,(istream *)&stream,&local_2b9);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)&archive,args,args_1,args_2,
             args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,args_12,args_13);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,_1U>::~InputArchive
            (&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }